

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest_main.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  UnitTest *pUVar4;
  TestEventListeners *this;
  TestEventListener *listener;
  char *__s1;
  long lVar5;
  int local_34;
  
  local_34 = argc;
  testing::InitGoogleMock(&local_34,argv);
  lVar5 = 1;
  signal(0xd,(__sighandler_t)0x1);
  pUVar4 = testing::UnitTest::GetInstance();
  this = testing::UnitTest::listeners(pUVar4);
  listener = (TestEventListener *)operator_new(8);
  listener->_vptr_TestEventListener = (_func_int **)&PTR__TestEventListener_006e21e0;
  testing::TestEventListeners::Append(this,listener);
  if (1 < local_34) {
    bVar1 = true;
    iVar3 = local_34;
    do {
      __s1 = argv[lVar5];
      iVar2 = strcmp(__s1,"--fork_unsafe_buffering");
      if (iVar2 == 0) {
        RAND_enable_fork_unsafe_buffering(-1);
        __s1 = argv[lVar5];
        iVar3 = local_34;
      }
      iVar2 = strcmp(__s1,"--no_unwind_tests");
      bVar1 = (bool)(bVar1 & iVar2 != 0);
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
    if (!bVar1) goto LAB_0037a9b7;
  }
  abi_test::EnableUnwindTests();
LAB_0037a9b7:
  pUVar4 = testing::UnitTest::GetInstance();
  iVar3 = testing::UnitTest::Run(pUVar4);
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
  testing::InitGoogleMock(&argc, argv);
  bssl::SetupGoogleTest();

  bool unwind_tests = true;
  for (int i = 1; i < argc; i++) {
#if !defined(OPENSSL_WINDOWS)
    if (strcmp(argv[i], "--fork_unsafe_buffering") == 0) {
      RAND_enable_fork_unsafe_buffering(-1);
    }
#endif

#if (defined(OPENSSL_ARM) || defined(OPENSSL_AARCH64)) && \
    !defined(OPENSSL_STATIC_ARMCAP)
    if (strncmp(argv[i], "--cpu=", 6) == 0) {
      const char *cpu = argv[i] + 6;
      uint32_t armcap;
      if (strcmp(cpu, "none") == 0) {
        armcap = 0;
      } else if (strcmp(cpu, "neon") == 0) {
        armcap = ARMV7_NEON;
      } else if (strcmp(cpu, "crypto") == 0) {
        armcap = ARMV7_NEON | ARMV8_AES | ARMV8_SHA1 | ARMV8_SHA256 | ARMV8_PMULL;
      } else {
        fprintf(stderr, "Unknown CPU: %s\n", cpu);
        exit(1);
      }

      uint32_t *armcap_ptr = OPENSSL_get_armcap_pointer_for_test();
      if ((armcap & *armcap_ptr) != armcap) {
        fprintf(stderr,
                "Host CPU does not support features for testing CPU '%s'.\n",
                cpu);
        exit(89);
      }
      printf("Simulating CPU '%s'\n", cpu);
      *armcap_ptr = armcap;
    }
#endif  // (ARM || AARCH64) && !STATIC_ARMCAP

    if (strcmp(argv[i], "--no_unwind_tests") == 0) {
      unwind_tests = false;
    }
  }

  if (unwind_tests) {
    abi_test::EnableUnwindTests();
  }

  return RUN_ALL_TESTS();
}